

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O3

void monster_group_remove_leader(chunk_conflict *c,monster *leader,monster_group *group)

{
  monster_group *group_00;
  _Bool _Var1;
  monster *pmVar2;
  chunk_conflict *c_00;
  long lVar3;
  wchar_t wVar4;
  uint uVar5;
  chunk_conflict *pcVar6;
  mon_group_list_entry *pmVar7;
  
  pmVar7 = group->member_list;
  if (pmVar7 != (mon_group_list_entry *)0x0) {
    wVar4 = L'\0';
    do {
      pmVar2 = cave_monster(c,pmVar7->midx);
      if (pmVar2 != (monster *)0x0) {
        if (((leader->race == pmVar2->race) && (wVar4 == L'\0')) &&
           (wVar4 = L'\0', pmVar2->group_info[0].role != MON_GROUP_SUMMON)) {
          wVar4 = pmVar2->midx;
        }
        _Var1 = monster_is_unique(pmVar2);
        if (_Var1) {
          wVar4 = pmVar2->midx;
        }
      }
      pmVar7 = pmVar7->next;
    } while (pmVar7 != (mon_group_list_entry *)0x0);
    if (wVar4 != L'\0') {
      group->leader = wVar4;
      pmVar7 = group->member_list;
      if (pmVar7 == (mon_group_list_entry *)0x0) {
        __assert_fail("list_entry",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-group.c"
                      ,0x85,
                      "void monster_group_remove_leader(struct chunk *, struct monster *, struct monster_group *)"
                     );
      }
      do {
        pmVar2 = cave_monster(c,pmVar7->midx);
        if (pmVar2->midx == wVar4) {
          pmVar2->group_info[0].role = MON_GROUP_LEADER;
          break;
        }
        pmVar7 = pmVar7->next;
      } while (pmVar7 != (mon_group_list_entry *)0x0);
      goto LAB_00171554;
    }
  }
  c_00 = (chunk_conflict *)mem_zalloc((ulong)z_info->level_monster_max << 2);
  pmVar7 = group->member_list;
  if (pmVar7 != (mon_group_list_entry *)0x0) {
    uVar5 = 0;
    do {
      pmVar2 = c->monsters + pmVar7->midx;
      if (0 < (int)uVar5) {
        pcVar6 = (chunk_conflict *)0x0;
        do {
          wVar4 = *(wchar_t *)((long)&c_00->name + (long)pcVar6 * 4);
          group_00 = c->monster_groups[wVar4];
          if (c->monsters[group_00->member_list->midx].race == pmVar2->race) {
            pmVar2->group_info[0].index = wVar4;
            pmVar2->group_info[0].role = MON_GROUP_MEMBER;
            monster_add_to_group((chunk_conflict *)(ulong)uVar5,pmVar2,group_00);
            break;
          }
          pcVar6 = (chunk_conflict *)((long)&pcVar6->name + 1);
        } while ((chunk_conflict *)(ulong)uVar5 != pcVar6);
      }
      if (pmVar2->group_info[0].index == group->index) {
        monster_group_start(c,pmVar2,L'\0');
        lVar3 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        *(wchar_t *)((long)&c_00->name + lVar3 * 4) = pmVar2->group_info[0].index;
      }
      pmVar7 = pmVar7->next;
    } while (pmVar7 != (mon_group_list_entry *)0x0);
  }
  mem_free(c_00);
  c->monster_groups[group->index] = (monster_group *)0x0;
  monster_group_free(c_00,group);
LAB_00171554:
  monster_groups_verify(c);
  return;
}

Assistant:

static void monster_group_remove_leader(struct chunk *c, struct monster *leader,
										struct monster_group *group)
{
	struct mon_group_list_entry *list_entry = group->member_list;
	int poss_leader = 0;

	/* Look for another leader */
	while (list_entry) {
		struct monster *mon = cave_monster(c, list_entry->midx);

		if (!mon) {
			list_entry = list_entry->next;
			continue;
		}

		/* Monsters of the same race can take over as leader */
		if ((leader->race == mon->race) && !poss_leader
			&& (mon->group_info[PRIMARY_GROUP].role != MON_GROUP_SUMMON)) {
			poss_leader = mon->midx;
		}

		/* Uniques always take over */
		if (monster_is_unique(mon)) {
			poss_leader = mon->midx;
		}
		list_entry = list_entry->next;
	}

	/* If no new leader, group fractures and old group is removed */
	if (!poss_leader) {
		monster_group_split(c, group, leader);
		c->monster_groups[group->index] = NULL;
		monster_group_free(c, group);
	} else {
		/* If there is a successor, appoint them and finalise changes */
		group->leader = poss_leader;
		list_entry = group->member_list;
		assert(list_entry);
		while (list_entry) {
			struct monster *mon = cave_monster(c, list_entry->midx);

			/* Record the leader */
			if (mon->midx == poss_leader) {
				mon->group_info[PRIMARY_GROUP].role = MON_GROUP_LEADER;
				break;
			}
			list_entry = list_entry->next;
		}
	}
	monster_groups_verify(c);
}